

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::accumulateDerivatives
          (BeagleCPUImpl<double,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double *in_RCX;
  double *in_RDX;
  BeagleCPUImpl<double,_1,_0> *in_RSI;
  double *in_RDI;
  
  if (in_RSI == (BeagleCPUImpl<double,_1,_0> *)0x0) {
    accumulateDerivativesDispatch1<false>((BeagleCPUImpl<double,_1,_0> *)0x0,in_RDX,in_RCX,in_RDI);
  }
  else {
    accumulateDerivativesDispatch1<true>(in_RSI,in_RDX,in_RCX,in_RDI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivatives(double* outDerivatives,
                                                              double* outSumDerivatives,
                                                              double* outSumSquaredDerivatives) {
    if (outDerivatives == NULL) {
        accumulateDerivativesDispatch1<false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch1<true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}